

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O3

int aom_count_primitive_refsubexpfin(uint16_t n,uint16_t k,uint16_t ref,uint16_t v)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined6 in_register_00000012;
  uint uVar5;
  int iVar6;
  undefined6 in_register_0000003a;
  
  uVar5 = (uint)v;
  iVar2 = (int)CONCAT62(in_register_00000012,ref);
  uVar3 = (uint)CONCAT62(in_register_0000003a,n);
  if (uVar3 < (uint)(iVar2 * 2)) {
    uVar1 = (uVar3 - 1) - iVar2;
    uVar5 = (uVar3 - 1) - uVar5;
    if ((uVar1 & 0xffff) * 2 < (uVar5 & 0xffff)) goto LAB_008ad5c8;
    if ((ushort)uVar5 < (ushort)uVar1) {
      uVar5 = (uVar1 - uVar5) * 2 - 1;
      goto LAB_008ad5c8;
    }
    iVar2 = uVar5 - uVar1;
  }
  else {
    if ((uint)(iVar2 * 2) < (uint)v) goto LAB_008ad5c8;
    if (v < ref) {
      uVar5 = (iVar2 - uVar5) * 2 - 1;
      goto LAB_008ad5c8;
    }
    iVar2 = uVar5 - iVar2;
  }
  uVar5 = iVar2 * 2;
LAB_008ad5c8:
  iVar2 = 0;
  iVar6 = 0;
  iVar4 = 0;
  if (3 << ((byte)k & 0x1f) < (int)uVar3) {
    iVar4 = 0;
    iVar6 = 0;
    uVar1 = (uint)k;
    do {
      iVar6 = (1 << ((byte)uVar1 & 0x1f)) + iVar6;
      if ((int)(uVar5 & 0xffff) < iVar6) {
        return uVar1 + iVar4 + 1;
      }
      uVar1 = iVar4 + (uint)k;
      iVar4 = iVar4 + 1;
    } while ((3 << ((byte)uVar1 & 0x1f)) + iVar6 < (int)uVar3);
  }
  if (1 < (ushort)(uVar3 - iVar6)) {
    uVar3 = uVar3 - iVar6 & 0xffff;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    iVar2 = (uint)((int)((2 << ((byte)iVar2 & 0x1f)) - uVar3) <= (int)(uVar5 - iVar6 & 0xffff)) +
            iVar2;
  }
  return iVar2 + iVar4;
}

Assistant:

int aom_count_primitive_refsubexpfin(uint16_t n, uint16_t k, uint16_t ref,
                                     uint16_t v) {
  return count_primitive_subexpfin(n, k, recenter_finite_nonneg(n, ref, v));
}